

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O1

int ParseEXRVersionFromFile(EXRVersion *version,char *filename)

{
  int iVar1;
  FILE *__stream;
  ulong uVar2;
  size_t sVar3;
  uchar buf [8];
  uchar local_20 [8];
  
  if (filename != (char *)0x0) {
    __stream = fopen(filename,"rb");
    if (__stream == (FILE *)0x0) {
      iVar1 = -7;
    }
    else {
      fseek(__stream,0,2);
      uVar2 = ftell(__stream);
      fseek(__stream,0,0);
      iVar1 = -5;
      if (7 < uVar2) {
        sVar3 = fread(local_20,1,8,__stream);
        fclose(__stream);
        iVar1 = -5;
        if (sVar3 == 8) {
          iVar1 = ParseEXRVersionFromMemory(version,local_20,8);
        }
      }
    }
    return iVar1;
  }
  return -3;
}

Assistant:

int ParseEXRVersionFromFile(EXRVersion *version, const char *filename) {
  if (filename == NULL) {
    return TINYEXR_ERROR_INVALID_ARGUMENT;
  }

  FILE *fp = NULL;
#ifdef _WIN32
#if defined(_MSC_VER) || (defined(MINGW_HAS_SECURE_API) && MINGW_HAS_SECURE_API) // MSVC, MinGW GCC, or Clang.
  errno_t err = _wfopen_s(&fp, tinyexr::UTF8ToWchar(filename).c_str(), L"rb");
  if (err != 0) {
    // TODO(syoyo): return wfopen_s erro code
    return TINYEXR_ERROR_CANT_OPEN_FILE;
  }
#else
  // Unknown compiler or MinGW without MINGW_HAS_SECURE_API.
  fp = fopen(filename, "rb");
#endif
#else
  fp = fopen(filename, "rb");
#endif
  if (!fp) {
    return TINYEXR_ERROR_CANT_OPEN_FILE;
  }

  size_t file_size;
  // Compute size
  fseek(fp, 0, SEEK_END);
  file_size = static_cast<size_t>(ftell(fp));
  fseek(fp, 0, SEEK_SET);

  if (file_size < tinyexr::kEXRVersionSize) {
    return TINYEXR_ERROR_INVALID_FILE;
  }

  unsigned char buf[tinyexr::kEXRVersionSize];
  size_t ret = fread(&buf[0], 1, tinyexr::kEXRVersionSize, fp);
  fclose(fp);

  if (ret != tinyexr::kEXRVersionSize) {
    return TINYEXR_ERROR_INVALID_FILE;
  }

  return ParseEXRVersionFromMemory(version, buf, tinyexr::kEXRVersionSize);
}